

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_crc32.c
# Opt level: O0

uint32_t calculate_crc32c(uint32_t crc32c,uchar *buffer,uint length)

{
  uint length_local;
  uchar *buffer_local;
  uint32_t crc32c_local;
  
  if (length < 4) {
    buffer_local._4_4_ = singletable_crc32c(crc32c,buffer,(ulong)length);
  }
  else {
    buffer_local._4_4_ = multitable_crc32c(crc32c,buffer,length);
  }
  return buffer_local._4_4_;
}

Assistant:

uint32_t calculate_crc32c(uint32_t crc32c, const unsigned char *buffer,
			  unsigned int length)
{
	if (length < 4)
		return (singletable_crc32c(crc32c, buffer, length));
	else
		return (multitable_crc32c(crc32c, buffer, length));
}